

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipkincore_types.cpp
# Opt level: O1

void __thiscall twitter::zipkin::thrift::Span::Span(Span *this,Span *other19)

{
  *(undefined ***)this = &PTR__Span_0026a950;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->annotations).
  super__Vector_base<twitter::zipkin::thrift::Annotation,_std::allocator<twitter::zipkin::thrift::Annotation>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->annotations).
  super__Vector_base<twitter::zipkin::thrift::Annotation,_std::allocator<twitter::zipkin::thrift::Annotation>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->annotations).
  super__Vector_base<twitter::zipkin::thrift::Annotation,_std::allocator<twitter::zipkin::thrift::Annotation>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->binary_annotations).
  super__Vector_base<twitter::zipkin::thrift::BinaryAnnotation,_std::allocator<twitter::zipkin::thrift::BinaryAnnotation>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->binary_annotations).
  super__Vector_base<twitter::zipkin::thrift::BinaryAnnotation,_std::allocator<twitter::zipkin::thrift::BinaryAnnotation>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->binary_annotations).
  super__Vector_base<twitter::zipkin::thrift::BinaryAnnotation,_std::allocator<twitter::zipkin::thrift::BinaryAnnotation>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->__isset = (_Span__isset)((ushort)*(undefined4 *)&this->__isset & 0xfc00 | 0x40);
  this->trace_id = other19->trace_id;
  std::__cxx11::string::_M_assign((string *)&this->name);
  this->id = other19->id;
  this->parent_id = other19->parent_id;
  std::
  vector<twitter::zipkin::thrift::Annotation,_std::allocator<twitter::zipkin::thrift::Annotation>_>
  ::operator=(&this->annotations,&other19->annotations);
  std::
  vector<twitter::zipkin::thrift::BinaryAnnotation,_std::allocator<twitter::zipkin::thrift::BinaryAnnotation>_>
  ::operator=(&this->binary_annotations,&other19->binary_annotations);
  this->debug = other19->debug;
  this->timestamp = other19->timestamp;
  this->duration = other19->duration;
  this->trace_id_high = other19->trace_id_high;
  this->__isset = other19->__isset;
  return;
}

Assistant:

Span::Span(const Span& other19) {
  trace_id = other19.trace_id;
  name = other19.name;
  id = other19.id;
  parent_id = other19.parent_id;
  annotations = other19.annotations;
  binary_annotations = other19.binary_annotations;
  debug = other19.debug;
  timestamp = other19.timestamp;
  duration = other19.duration;
  trace_id_high = other19.trace_id_high;
  __isset = other19.__isset;
}